

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::PrimitiveColumnWriter::FinalizeWrite(PrimitiveColumnWriter *this,ColumnWriterState *state_p)

{
  _Statistics__isset *p_Var1;
  _ColumnMetaData__isset *p_Var2;
  ParquetWriter *this_00;
  _Head_base<0UL,_duckdb::ParquetBloomFilter_*,_false> _Var3;
  PrimitiveColumnWriter *pPVar4;
  ColumnWriterState *pCVar5;
  int iVar6;
  reference column_chunk;
  type this_01;
  undefined4 extraout_var;
  idx_t iVar7;
  idx_t iVar8;
  PageWriteInformation *write_info;
  pointer puVar9;
  pointer *__ptr;
  long lVar10;
  _Head_base<0UL,_duckdb::ParquetBloomFilter_*,_false> local_58;
  PrimitiveColumnWriter *local_50;
  idx_t local_48;
  ColumnWriterState *local_40;
  pointer local_38;
  
  column_chunk = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                           ((vector<duckdb_parquet::ColumnChunk,_true> *)
                            (state_p[1].definition_levels.
                             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + 4),
                            (size_type)
                            state_p[1].definition_levels.
                            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
  FlushPage(this,(PrimitiveColumnWriterState *)state_p);
  this_01 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
            ::operator*(&((this->super_ColumnWriter).writer)->writer);
  local_48 = BufferedFileWriter::GetTotalWritten(this_01);
  iVar6 = (*(this->super_ColumnWriter)._vptr_ColumnWriter[0x10])(this,state_p);
  if ((char)iVar6 != '\0') {
    iVar6 = (*(this->super_ColumnWriter)._vptr_ColumnWriter[0x11])(this,state_p);
    (column_chunk->meta_data).statistics.distinct_count = CONCAT44(extraout_var,iVar6);
    p_Var1 = &(column_chunk->meta_data).statistics.__isset;
    *p_Var1 = (_Statistics__isset)((byte)*p_Var1 | 8);
    iVar7 = BufferedFileWriter::GetTotalWritten(this_01);
    (column_chunk->meta_data).dictionary_page_offset = iVar7;
    p_Var2 = &(column_chunk->meta_data).__isset;
    *p_Var2 = (_ColumnMetaData__isset)((byte)*p_Var2 | 4);
    (*(this->super_ColumnWriter)._vptr_ColumnWriter[0x12])
              (this,state_p,
               state_p[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p);
  }
  (column_chunk->meta_data).data_page_offset = 0;
  local_50 = this;
  SetParquetStatistics(this,(PrimitiveColumnWriterState *)state_p,column_chunk);
  pPVar4 = local_50;
  puVar9 = state_p[1].repetition_levels.
           super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_38 = (pointer)state_p[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
  lVar10 = 0;
  local_40 = state_p;
  if (puVar9 != local_38) {
    do {
      if (((column_chunk->meta_data).data_page_offset == 0) &&
         ((*(int *)(puVar9 + 4) == 3 || (*(int *)(puVar9 + 4) == 0)))) {
        iVar7 = BufferedFileWriter::GetTotalWritten(this_01);
        (column_chunk->meta_data).data_page_offset = iVar7;
      }
      iVar7 = BufferedFileWriter::GetTotalWritten(this_01);
      ParquetWriter::Write
                ((pPVar4->super_ColumnWriter).writer,
                 (TBase *)(*(long *)(*(long *)puVar9 + -0x30) + (long)puVar9));
      iVar8 = BufferedFileWriter::GetTotalWritten(this_01);
      lVar10 = (lVar10 - iVar7) + iVar8 + (long)*(int *)(puVar9 + 6);
      ParquetWriter::WriteData
                ((pPVar4->super_ColumnWriter).writer,*(const_data_ptr_t *)(puVar9 + 0x100),
                 *(uint32_t *)(puVar9 + 0xfc));
      puVar9 = puVar9 + 0x110;
    } while (puVar9 != local_38);
  }
  iVar7 = BufferedFileWriter::GetTotalWritten(this_01);
  pCVar5 = local_40;
  pPVar4 = local_50;
  (column_chunk->meta_data).total_compressed_size = iVar7 - local_48;
  (column_chunk->meta_data).total_uncompressed_size = lVar10;
  puVar9 = local_40[1].definition_levels.
           super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 0x10;
  *(long *)puVar9 = *(long *)puVar9 + lVar10;
  if (local_40[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
      != (_Bit_pointer)0x0) {
    this_00 = (local_50->super_ColumnWriter).writer;
    puVar9 = local_40[1].definition_levels.
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_58._M_head_impl =
         (ParquetBloomFilter *)
         local_40[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_end_of_storage;
    local_40[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
         (_Bit_pointer)0x0;
    ParquetWriter::BufferBloomFilter
              (this_00,(idx_t)puVar9,
               (unique_ptr<duckdb::ParquetBloomFilter,_std::default_delete<duckdb::ParquetBloomFilter>,_true>
                *)&local_58);
    _Var3._M_head_impl = local_58._M_head_impl;
    if (local_58._M_head_impl != (ParquetBloomFilter *)0x0) {
      ::std::unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>::
      ~unique_ptr((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>
                   *)local_58._M_head_impl);
      operator_delete(_Var3._M_head_impl);
    }
    local_58._M_head_impl = (ParquetBloomFilter *)0x0;
  }
  ParquetWriter::FlushColumnStats
            ((pPVar4->super_ColumnWriter).writer,
             (idx_t)pCVar5[1].definition_levels.
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish,column_chunk,
             (ColumnWriterStatistics *)
             pCVar5[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_p);
  return;
}

Assistant:

void PrimitiveColumnWriter::FinalizeWrite(ColumnWriterState &state_p) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();
	auto &column_chunk = state.row_group.columns[state.col_idx];

	// flush the last page (if any remains)
	FlushPage(state);

	auto &column_writer = writer.GetWriter();
	auto start_offset = column_writer.GetTotalWritten();
	// flush the dictionary
	if (HasDictionary(state)) {
		column_chunk.meta_data.statistics.distinct_count = UnsafeNumericCast<int64_t>(DictionarySize(state));
		column_chunk.meta_data.statistics.__isset.distinct_count = true;
		column_chunk.meta_data.dictionary_page_offset = UnsafeNumericCast<int64_t>(column_writer.GetTotalWritten());
		column_chunk.meta_data.__isset.dictionary_page_offset = true;
		FlushDictionary(state, state.stats_state.get());
	}

	// record the start position of the pages for this column
	column_chunk.meta_data.data_page_offset = 0;
	SetParquetStatistics(state, column_chunk);

	// write the individual pages to disk
	idx_t total_uncompressed_size = 0;
	for (auto &write_info : state.write_info) {
		// set the data page offset whenever we see the *first* data page
		if (column_chunk.meta_data.data_page_offset == 0 && (write_info.page_header.type == PageType::DATA_PAGE ||
		                                                     write_info.page_header.type == PageType::DATA_PAGE_V2)) {
			column_chunk.meta_data.data_page_offset = UnsafeNumericCast<int64_t>(column_writer.GetTotalWritten());
		}
		D_ASSERT(write_info.page_header.uncompressed_page_size > 0);
		auto header_start_offset = column_writer.GetTotalWritten();
		writer.Write(write_info.page_header);
		// total uncompressed size in the column chunk includes the header size (!)
		total_uncompressed_size += column_writer.GetTotalWritten() - header_start_offset;
		total_uncompressed_size += write_info.page_header.uncompressed_page_size;
		writer.WriteData(write_info.compressed_data, write_info.compressed_size);
	}
	column_chunk.meta_data.total_compressed_size =
	    UnsafeNumericCast<int64_t>(column_writer.GetTotalWritten() - start_offset);
	column_chunk.meta_data.total_uncompressed_size = UnsafeNumericCast<int64_t>(total_uncompressed_size);
	state.row_group.total_byte_size += column_chunk.meta_data.total_uncompressed_size;

	if (state.bloom_filter) {
		writer.BufferBloomFilter(state.col_idx, std::move(state.bloom_filter));
	}

	// finalize the stats
	writer.FlushColumnStats(state.col_idx, column_chunk, state.stats_state.get());
}